

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::MixtureIngredient::calcGeometricProps
          (MixtureIngredient *this,ChVector<double> *size,double *volume,ChVector<double> *gyration)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChVector<double> local_98;
  ChQuaternion<double> local_80;
  ChMatrix33<double> local_60;
  
  if (ROUNDEDCYLINDER < this->m_type) {
    return;
  }
  switch(this->m_type) {
  case SPHERE:
    dVar2 = size->m_data[0];
    *volume = dVar2 * dVar2 * dVar2 * 4.1887902047863905;
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcSphereGyration(&local_60,size->m_data[0],&local_98,&local_80);
    break;
  case ELLIPSOID:
    *volume = size->m_data[0] * 4.1887902047863905 * size->m_data[1] * size->m_data[2];
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcEllipsoidGyration(&local_60,size,&local_98,&local_80);
    goto LAB_00e3802c;
  case BOX:
    *volume = size->m_data[0] * 8.0 * size->m_data[1] * size->m_data[2];
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcBoxGyration(&local_60,size,&local_98,&local_80);
LAB_00e3802c:
    gyration->m_data[0] =
         local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    gyration->m_data[1] =
         local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    goto LAB_00e38130;
  case CYLINDER:
    *volume = size->m_data[0] * size->m_data[0] * 6.283185307179586 * size->m_data[1];
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcCylinderGyration(&local_60,size->m_data[0],size->m_data[1],&local_98,&local_80);
    break;
  case CONE:
    *volume = (size->m_data[0] * size->m_data[0] * 3.141592653589793 * size->m_data[1]) / 3.0;
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcConeGyration(&local_60,size->m_data[0],size->m_data[1],&local_98,&local_80);
    break;
  case CAPSULE:
    dVar2 = size->m_data[0];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size->m_data[1];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2 * dVar2 * dVar2 * 0.6666666666666666;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar2 * dVar2;
    auVar1 = vfmadd231sd_fma(auVar3,auVar4,auVar1);
    *volume = auVar1._0_8_ * 6.283185307179586;
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcCapsuleGyration(&local_60,size->m_data[0],size->m_data[1],&local_98,&local_80);
    break;
  case BISPHERE:
    dVar2 = CalcBiSphereVolume(size->m_data[0],size->m_data[1]);
    *volume = dVar2;
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcBiSphereGyration(&local_60,size->m_data[0],size->m_data[1],&local_98,&local_80);
    break;
  case ROUNDEDCYLINDER:
    dVar2 = CalcRoundedCylinderVolume(size->m_data[0],size->m_data[1],size->m_data[2]);
    *volume = dVar2;
    local_80.m_data[0] = 1.0;
    local_98.m_data[2] = 0.0;
    local_80.m_data[3] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_80.m_data[1] = 0.0;
    local_80.m_data[2] = 0.0;
    CalcRoundedCylinderGyration
              (&local_60,size->m_data[0],size->m_data[1],size->m_data[2],&local_98,&local_80);
  }
  gyration->m_data[0] =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  gyration->m_data[1] =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
LAB_00e38130:
  gyration->m_data[2] =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  return;
}

Assistant:

void MixtureIngredient::calcGeometricProps(const ChVector<>& size, double& volume, ChVector<>& gyration) {
    switch (m_type) {
        case MixtureType::SPHERE:
            volume = CalcSphereVolume(size.x());
            gyration = CalcSphereGyration(size.x()).diagonal();
            break;
        case MixtureType::ELLIPSOID:
            volume = CalcEllipsoidVolume(size);
            gyration = CalcEllipsoidGyration(size).diagonal();
            break;
        case MixtureType::BOX:
            volume = CalcBoxVolume(size);
            gyration = CalcBoxGyration(size).diagonal();
            break;
        case MixtureType::CYLINDER:
            volume = CalcCylinderVolume(size.x(), size.y());
            gyration = CalcCylinderGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::CONE:
            volume = CalcConeVolume(size.x(), size.y());
            gyration = CalcConeGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::BISPHERE:
            volume = CalcBiSphereVolume(size.x(), size.y());
            gyration = CalcBiSphereGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::CAPSULE:
            volume = CalcCapsuleVolume(size.x(), size.y());
            gyration = CalcCapsuleGyration(size.x(), size.y()).diagonal();
            break;
        case MixtureType::ROUNDEDCYLINDER:
            volume = CalcRoundedCylinderVolume(size.x(), size.y(), size.z());
            gyration = CalcRoundedCylinderGyration(size.x(), size.y(), size.z()).diagonal();
            break;
    }
}